

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::_InternalParse
          (CustomLayerParams_CustomLayerParamValue *this,char *ptr,ParseContext *ctx)

{
  ValueUnion *pVVar1;
  byte bVar2;
  byte bVar3;
  internal *this_00;
  size_t size;
  bool bVar4;
  uint uVar5;
  string *s;
  uint32_t uVar6;
  undefined8 *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *field_name;
  InternalMetadata *this_01;
  char cVar8;
  uint uVar9;
  int64_t iVar10;
  pair<const_char_*,_unsigned_int> pVar11;
  pair<const_char_*,_unsigned_long> pVar12;
  pair<const_char_*,_unsigned_long> pVar13;
  StringPiece str;
  byte *local_48;
  int64_t local_40;
  InternalMetadata *local_38;
  
  local_48 = (byte *)ptr;
  bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
  if (!bVar4) {
    pVVar1 = &this->value_;
    this_01 = &(this->super_MessageLite)._internal_metadata_;
    local_38 = this_01;
    do {
      bVar2 = *local_48;
      uVar9 = (uint)bVar2;
      field_name = local_48 + 1;
      if ((char)bVar2 < '\0') {
        uVar9 = ((uint)bVar2 + (uint)*field_name * 0x80) - 0x80;
        if ((char)*field_name < '\0') {
          pVar11 = google::protobuf::internal::ReadTagFallback((char *)local_48,uVar9);
          field_name = (byte *)pVar11.first;
          uVar9 = pVar11.second;
        }
        else {
          field_name = local_48 + 2;
        }
      }
      uVar5 = uVar9 >> 3;
      cVar8 = (char)uVar9;
      local_48 = field_name;
      if (uVar5 < 0x1e) {
        if (uVar5 != 10) {
          if ((uVar5 == 0x14) && (cVar8 == -0x5e)) {
            if (this->_oneof_case_[0] != 0x14) {
              clear_value(this);
              this->_oneof_case_[0] = 0x14;
              (this->value_).doublevalue_ =
                   (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
            }
            puVar7 = (undefined8 *)(this_01->ptr_ & 0xfffffffffffffffc);
            if ((this_01->ptr_ & 1U) != 0) {
              puVar7 = (undefined8 *)*puVar7;
            }
            s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                          ((ArenaStringPtr *)pVVar1,puVar7);
            local_48 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                         (s,(char *)local_48,ctx);
            this_00 = (internal *)(s->_M_dataplus)._M_p;
            size = s->_M_string_length;
            if ((long)size < 0) {
              google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                        (size,"string length exceeds max size");
            }
            str.length_ = 0;
            str.ptr_ = (char *)size;
            bVar4 = google::protobuf::internal::VerifyUTF8(this_00,str,(char *)field_name);
            this_01 = local_38;
            if (!bVar4) {
              return (char *)0x0;
            }
            goto joined_r0x00280696;
          }
LAB_00280761:
          if ((uVar9 == 0) || ((uVar9 & 7) == 4)) {
            if (field_name == (byte *)0x0) {
              return (char *)0x0;
            }
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar9 - 1;
            return (char *)field_name;
          }
          if ((this_01->ptr_ & 1U) == 0) {
            unknown = google::protobuf::internal::InternalMetadata::
                      mutable_unknown_fields_slow<std::__cxx11::string>(this_01);
          }
          else {
            unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((this_01->ptr_ & 0xfffffffffffffffcU) + 8);
          }
          local_48 = (byte *)google::protobuf::internal::UnknownFieldParse
                                       (uVar9,unknown,(char *)local_48,ctx);
          goto joined_r0x00280696;
        }
        if (cVar8 != 'Q') goto LAB_00280761;
        iVar10 = *(int64_t *)field_name;
        if (this->_oneof_case_[0] != 10) {
          local_40 = *(int64_t *)field_name;
          clear_value(this);
          this->_oneof_case_[0] = 10;
          iVar10 = local_40;
        }
        pVVar1->longvalue_ = iVar10;
        local_48 = local_48 + 8;
      }
      else {
        if (uVar5 == 0x1e) {
          if (cVar8 != -0x10) goto LAB_00280761;
          bVar2 = *field_name;
          uVar9 = (uint)bVar2;
          local_48 = field_name + 1;
          if ((char)bVar2 < '\0') {
            uVar9 = ((uint)bVar2 + (uint)*local_48 * 0x80) - 0x80;
            if ((char)*local_48 < '\0') {
              local_48 = field_name;
              pVar11 = google::protobuf::internal::VarintParseSlow32((char *)field_name,uVar9);
              local_48 = (byte *)pVar11.first;
              uVar9 = pVar11.second;
            }
            else {
              local_48 = field_name + 2;
            }
          }
          if (this->_oneof_case_[0] != 0x1e) {
            clear_value(this);
            this->_oneof_case_[0] = 0x1e;
          }
          *(uint *)pVVar1 = uVar9;
        }
        else if (uVar5 == 0x28) {
          if (cVar8 != '@') goto LAB_00280761;
          bVar2 = *field_name;
          pVar12.second = (long)(char)bVar2;
          pVar12.first = (char *)(field_name + 1);
          if ((long)(char)bVar2 < 0) {
            bVar3 = field_name[1];
            uVar6 = ((uint)bVar3 * 0x80 + (uint)bVar2) - 0x80;
            if ((char)bVar3 < '\0') {
              pVar12 = google::protobuf::internal::VarintParseSlow64((char *)field_name,uVar6);
            }
            else {
              pVar12.second._0_4_ = uVar6;
              pVar12.first = (char *)(field_name + 2);
              pVar12.second._4_4_ = 0;
            }
          }
          local_48 = (byte *)pVar12.first;
          if (this->_oneof_case_[0] != 0x28) {
            clear_value(this);
            this->_oneof_case_[0] = 0x28;
          }
          pVVar1->longvalue_ = pVar12.second;
        }
        else {
          if ((uVar5 != 0x32) || (cVar8 != -0x70)) goto LAB_00280761;
          bVar2 = *field_name;
          pVar13.second = (long)(char)bVar2;
          pVar13.first = (char *)(field_name + 1);
          if ((long)(char)bVar2 < 0) {
            bVar3 = field_name[1];
            uVar6 = ((uint)bVar3 * 0x80 + (uint)bVar2) - 0x80;
            if ((char)bVar3 < '\0') {
              pVar13 = google::protobuf::internal::VarintParseSlow64((char *)field_name,uVar6);
            }
            else {
              pVar13.second._0_4_ = uVar6;
              pVar13.first = (char *)(field_name + 2);
              pVar13.second._4_4_ = 0;
            }
          }
          local_48 = (byte *)pVar13.first;
          if (this->_oneof_case_[0] != 0x32) {
            clear_value(this);
            this->_oneof_case_[0] = 0x32;
          }
          pVVar1->boolvalue_ = pVar13.second != 0;
        }
joined_r0x00280696:
        if (local_48 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
    } while (!bVar4);
  }
  return (char *)local_48;
}

Assistant:

const char* CustomLayerParams_CustomLayerParamValue::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // double doubleValue = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 81)) {
          _internal_set_doublevalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // string stringValue = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          auto str = _internal_mutable_stringvalue();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 intValue = 30;
      case 30:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 240)) {
          _internal_set_intvalue(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int64 longValue = 40;
      case 40:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 64)) {
          _internal_set_longvalue(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool boolValue = 50;
      case 50:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 144)) {
          _internal_set_boolvalue(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}